

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall
Inject::ctor_inject::ctor_inject
          (ctor_inject *this,type *service1,type *service2,type *service3,type *service4,
          type *service5)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *plVar4;
  type psVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  unique_id local_250;
  undefined8 local_248;
  basic_cstring<const_char> local_240;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_230;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  unique_id local_1e8;
  undefined8 local_1e0;
  basic_cstring<const_char> local_1d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1c8;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  unique_id local_180;
  undefined8 local_178;
  basic_cstring<const_char> local_170;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_160;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  unique_id local_118;
  undefined8 local_110;
  basic_cstring<const_char> local_108;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f8;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  unique_id local_b0;
  undefined8 local_a8 [3];
  basic_cstring<const_char> local_90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_80;
  basic_cstring<const_char> local_58;
  basic_cstring<const_char> local_48;
  type *local_38;
  type *service5_local;
  type *service4_local;
  type *service3_local;
  type *service2_local;
  type *service1_local;
  ctor_inject *this_local;
  
  this->ctor_num = 5;
  local_38 = service5;
  service5_local = service4;
  service4_local = service3;
  service3_local = service2;
  service2_local = service1;
  service1_local = (type *)this;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_58);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_48,0x26f,&local_58);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_80,plVar4,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar5 = boost::shared_ptr<Inject::service>::operator->(service1);
    iVar3 = (**psVar5->_vptr_service)();
    local_a8[0] = CONCAT44(extraout_var,iVar3);
    local_b0 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_80,&local_90,0x26f,1,2,local_a8,"service1->id()",&local_b0,
               "id_of<impl1>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_80);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c0,0x270,&local_d0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f8,plVar4,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar5 = boost::shared_ptr<Inject::service>::operator->(service2);
    iVar3 = (**psVar5->_vptr_service)();
    local_110 = CONCAT44(extraout_var_00,iVar3);
    local_118 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_f8,&local_108,0x270,1,2,&local_110,"service2->id()",&local_118,
               "id_of<impl1>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_138);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_128,0x271,&local_138);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_160,plVar4,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar5 = boost::shared_ptr<Inject::service>::operator->(service3);
    iVar3 = (**psVar5->_vptr_service)();
    local_178 = CONCAT44(extraout_var_01,iVar3);
    local_180 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_160,&local_170,0x271,1,2,&local_178,"service3->id()",&local_180,
               "id_of<impl1>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_160);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_190,0x272,&local_1a0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1c8,plVar4,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar5 = boost::shared_ptr<Inject::service>::operator->(service4);
    iVar3 = (**psVar5->_vptr_service)();
    local_1e0 = CONCAT44(extraout_var_02,iVar3);
    local_1e8 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_1c8,&local_1d8,0x272,1,2,&local_1e0,"service4->id()",&local_1e8,
               "id_of<impl1>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f8,0x273,&local_208);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_230,plVar4,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar5 = boost::shared_ptr<Inject::service>::operator->(service5);
    iVar3 = (**psVar5->_vptr_service)();
    local_248 = CONCAT44(extraout_var_03,iVar3);
    local_250 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_230,&local_240,0x273,1,2,&local_248,"service5->id()",&local_250,
               "id_of<impl1>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_230);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1,
            context<>::ptr<service>::type service2,
            context<>::ptr<service>::type service3,
            context<>::ptr<service>::type service4,
            context<>::ptr<service>::type service5) {
        ctor_num = 5;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service2->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service3->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service4->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service5->id(), id_of<impl1>::id());
    }